

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O2

int32_t mtmd_encode(mtmd_context *ctx,mtmd_image_tokens *image_tokens)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *entries;
  clip_image_size local_38;
  
  iVar3 = clip_n_mmproj_embd(ctx->ctx_clip);
  std::vector<float,_std::allocator<float>_>::resize
            (&ctx->image_embd_v,(ulong)(image_tokens->nx * iVar3 * image_tokens->ny));
  local_38 = *(clip_image_size *)
              (((image_tokens->batch_f32).entries.
                super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
              super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
  clip_add_load_image_size(ctx->ctx_clip,&local_38);
  bVar2 = clip_is_llava(ctx->ctx_clip);
  if (!bVar2) {
    iVar4 = clip_is_minicpmv(ctx->ctx_clip);
    if (iVar4 == 0) {
      bVar2 = clip_is_glm(ctx->ctx_clip);
      if (!bVar2) {
        bVar2 = clip_image_batch_encode
                          (ctx->ctx_clip,ctx->n_threads,&image_tokens->batch_f32,
                           (ctx->image_embd_v).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        goto LAB_00132bb5;
      }
    }
  }
  lVar6 = 0;
  bVar2 = false;
  for (uVar5 = 0;
      puVar1 = (image_tokens->batch_f32).entries.
               super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(image_tokens->batch_f32).entries.
                            super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar5 = uVar5 + 1) {
    iVar4 = clip_n_patches_by_img
                      (ctx->ctx_clip,
                       (clip_image_f32 *)
                       puVar1[uVar5]._M_t.
                       super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>);
    bVar2 = clip_image_encode(ctx->ctx_clip,ctx->n_threads,
                              (clip_image_f32 *)
                              (image_tokens->batch_f32).entries.
                              super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                              super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>,
                              (ctx->image_embd_v).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start + iVar4 * lVar6);
    lVar6 = lVar6 + iVar3;
  }
LAB_00132bb5:
  return (byte)~bVar2 & 1;
}

Assistant:

int32_t mtmd_encode(mtmd_context * ctx, const mtmd_image_tokens * image_tokens) {
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);
    ctx->image_embd_v.resize(image_tokens->n_tokens() * n_mmproj_embd);
    bool ok = false;

    // only effective for minicpmv and qwen2vl, other models will ignore load_image_size
    {
        clip_image_size slice_size{
            image_tokens->batch_f32.entries[0]->nx,
            image_tokens->batch_f32.entries[0]->ny};
        clip_add_load_image_size(ctx->ctx_clip, &slice_size);
    }

    if (clip_is_llava(ctx->ctx_clip) || clip_is_minicpmv(ctx->ctx_clip) || clip_is_glm(ctx->ctx_clip)) {
        // TODO @ngxson : llava does not support batched encoding ; this should be fixed inside clip_image_batch_encode()
        const auto & entries = image_tokens->batch_f32.entries;
        for (size_t i = 0; i < entries.size(); i++) {
            int n_tokens_per_image = clip_n_patches_by_img(ctx->ctx_clip, entries[i].get());
            ok = clip_image_encode(
                ctx->ctx_clip,
                ctx->n_threads,
                entries[i].get(),
                ctx->image_embd_v.data() + i*n_mmproj_embd*n_tokens_per_image);
        }
    } else {
        ok = clip_image_batch_encode(
            ctx->ctx_clip,
            ctx->n_threads,
            &image_tokens->batch_f32,
            ctx->image_embd_v.data());
    }

    return ok ? 0 : 1;
}